

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

bool __thiscall Debugger::ProcessBreakPoint(Debugger *this,shared_ptr<BreakPoint> *bp)

{
  element_type *peVar1;
  bool bVar2;
  Variable *pVVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Debugger *this_01;
  shared_ptr<EvalContext> ctx;
  __shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar1 = (bp->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1->condition)._M_string_length == 0) {
    if ((peVar1->logMessage)._M_string_length != 0) {
      std::__shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,&bp->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>);
      DoLogMessage(this,(shared_ptr<BreakPoint> *)&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      return false;
    }
    if ((peVar1->hitCondition)._M_string_length == 0) {
      return true;
    }
    peVar1->hitCount = peVar1->hitCount + 1;
    this_01 = (Debugger *)&stack0xffffffffffffffd8;
    std::__shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8,
               &bp->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>);
    bVar2 = DoHitCondition(this_01,(shared_ptr<BreakPoint> *)&stack0xffffffffffffffd8);
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0;
  }
  else {
    std::make_shared<EvalContext>();
    std::__cxx11::string::_M_assign((string *)&(local_58._M_ptr)->expr);
    (local_58._M_ptr)->depth = 1;
    std::__shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_38,&local_58);
    bVar2 = DoEval(this,(shared_ptr<EvalContext> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    if ((bVar2) &&
       (pVVar3 = Idx<Variable>::operator->(&(local_58._M_ptr)->result), pVVar3->valueType == 1)) {
      pVVar3 = Idx<Variable>::operator->(&(local_58._M_ptr)->result);
      bVar2 = std::operator==(&pVVar3->value,"true");
    }
    else {
      bVar2 = false;
    }
    this_00 = &local_58._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return bVar2;
}

Assistant:

bool Debugger::ProcessBreakPoint(std::shared_ptr<BreakPoint> bp) {
	if (!bp->condition.empty()) {
		auto ctx = std::make_shared<EvalContext>();
		ctx->expr = bp->condition;
		ctx->depth = 1;
		bool suc = DoEval(ctx);
		return suc && ctx->result->valueType == LUA_TBOOLEAN && ctx->result->value == "true";
	}
	if (!bp->logMessage.empty()) {
		DoLogMessage(bp);
		return false;
	}
	if (!bp->hitCondition.empty()) {
		bp->hitCount++;

		return DoHitCondition(bp);
	}
	return true;
}